

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

int __thiscall
unodb::detail::
basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::init(basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  element_type new_value;
  value_type vVar2;
  int extraout_EAX;
  pointer pbVar3;
  reference peVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  *in_RCX;
  basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *in_RDX;
  basic_node_ptr<unodb::detail::olc_node_header> local_68;
  uint local_60;
  uint local_5c;
  uint i;
  uint insert_pos_index;
  element_type local_41;
  undefined1 local_40 [7];
  uint8_t key_byte;
  db_inode_reclaimable_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte>,_std::span<const_std::byte>_>_>
  reclaim_source_node;
  db_leaf_unique_ptr *child_local;
  inode4_type *source_node_local;
  db_type *db_instance_local;
  basic_inode_16<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
  *this_local;
  tree_depth_type depth_local;
  
  basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
  ::
  make_db_inode_reclaimable_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
            ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              *)local_40,
             (olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
              *)in_RDX,(db_type *)ctx);
  pbVar3 = std::
           unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ::operator->(in_RCX);
  _i = basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
       ::get_key_view(pbVar3);
  vVar2 = tree_depth::operator_cast_to_unsigned_int((tree_depth *)((long)&this_local + 4));
  peVar4 = std::span<const_std::byte,_18446744073709551615UL>::operator[]
                     ((span<const_std::byte,_18446744073709551615UL> *)&i,(ulong)vVar2);
  local_41 = *peVar4;
  local_5c = basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
             ::get_insert_pos(in_RDX,local_41,0xf);
  for (local_60 = 0; new_value = local_41, local_60 < local_5c; local_60 = local_60 + 1) {
    pvVar5 = std::array<unodb::in_critical_section<std::byte>,_4UL>::operator[]
                       (&(in_RDX->keys).byte_array,(ulong)local_60);
    pvVar6 = std::array<unodb::in_critical_section<std::byte>,_16UL>::operator[]
                       (&(this->keys).byte_array,(ulong)local_60);
    in_critical_section<std::byte>::operator=(pvVar6,pvVar5);
    pvVar7 = std::
             array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
             ::operator[](&in_RDX->children,(ulong)local_60);
    pvVar8 = std::
             array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_16UL>
             ::operator[](&this->children,(ulong)local_60);
    in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
              (pvVar8,pvVar7);
  }
  if (local_60 < 0x10) {
    pvVar6 = std::array<unodb::in_critical_section<std::byte>,_16UL>::operator[]
                       (&(this->keys).byte_array,(ulong)local_60);
    in_critical_section<std::byte>::operator=(pvVar6,new_value);
    pbVar3 = std::
             unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
             ::release(in_RCX);
    basic_node_ptr<unodb::detail::olc_node_header>::basic_node_ptr
              (&local_68,&pbVar3->super_olc_node_header,LEAF);
    pvVar8 = std::
             array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_16UL>
             ::operator[](&this->children,(ulong)local_60);
    in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
              (pvVar8,local_68);
    uVar1 = local_60;
    while (local_60 = uVar1 + 1, local_60 < 5) {
      pvVar5 = std::array<unodb::in_critical_section<std::byte>,_4UL>::operator[]
                         (&(in_RDX->keys).byte_array,(ulong)uVar1);
      pvVar6 = std::array<unodb::in_critical_section<std::byte>,_16UL>::operator[]
                         (&(this->keys).byte_array,(ulong)local_60);
      in_critical_section<std::byte>::operator=(pvVar6,pvVar5);
      pvVar7 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_4UL>
               ::operator[](&in_RDX->children,(ulong)(local_60 - 1));
      pvVar8 = std::
               array<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>,_16UL>
               ::operator[](&this->children,(ulong)local_60);
      in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>::operator=
                (pvVar8,pvVar7);
      uVar1 = local_60;
    }
    std::
    unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::db_inode_qsbr_deleter<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                   *)local_40);
    return extraout_EAX;
  }
  __assert_fail("i < parent_class::capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x6f6,
                "void unodb::detail::basic_inode_16<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::init(db_type &, inode4_type &, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void init(db_type &db_instance, inode4_type &source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode4_type>(
            &source_node, db_instance)};
    const auto key_byte =
        static_cast<std::uint8_t>(child->get_key_view()[depth]);

#ifdef UNODB_DETAIL_X86_64
    const auto insert_pos_index = source_node.get_insert_pos(key_byte, 0xFU);
#else
    const auto keys_integer = source_node.keys.integer.load();
    const auto first_lt = ((keys_integer & 0xFFU) < key_byte) ? 1 : 0;
    const auto second_lt = (((keys_integer >> 8U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto third_lt = (((keys_integer >> 16U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto fourth_lt = (((keys_integer >> 24U) & 0xFFU) < key_byte) ? 1 : 0;
    const auto insert_pos_index =
        static_cast<unsigned>(first_lt + second_lt + third_lt + fourth_lt);
#endif

    unsigned i = 0;
    for (; i < insert_pos_index; ++i) {
      keys.byte_array[i] = source_node.keys.byte_array[i];
      children[i] = source_node.children[i];
    }

    UNODB_DETAIL_ASSUME(i < parent_class::capacity);

    keys.byte_array[i] = static_cast<std::byte>(key_byte);
    children[i] = node_ptr{child.release(), node_type::LEAF};
    ++i;

    for (; i <= inode4_type::capacity; ++i) {
      keys.byte_array[i] = source_node.keys.byte_array[i - 1];
      children[i] = source_node.children[i - 1];
    }
  }